

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O1

void InitUnigramTable(void)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  FILE *in_RSI;
  undefined4 *puVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double local_20;
  
  puVar4 = (undefined4 *)0x17d78400;
  table = (int *)malloc(400000000);
  if (table != (int *)0x0) {
    if (vocab_size < 1) {
      local_20 = 0.0;
    }
    else {
      local_20 = 0.0;
      lVar2 = 0;
      lVar6 = 0;
      do {
        dVar7 = pow((double)*(long *)((long)&vocab->cn + lVar2),0.75);
        local_20 = local_20 + dVar7;
        lVar6 = lVar6 + 1;
        lVar2 = lVar2 + 0x28;
      } while (lVar6 < vocab_size);
    }
    dVar7 = pow((double)vocab->cn,0.75);
    dVar7 = dVar7 / local_20;
    lVar2 = 0;
    iVar5 = 0;
    do {
      table[lVar2] = iVar5;
      if (dVar7 < (double)(int)lVar2 / 100000000.0) {
        iVar5 = iVar5 + 1;
        dVar8 = pow((double)vocab[iVar5].cn,0.75);
        dVar7 = dVar7 + dVar8 / local_20;
      }
      if (vocab_size <= iVar5) {
        iVar5 = (int)vocab_size + -1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 100000000);
    return;
  }
  InitUnigramTable_cold_1();
  iVar5 = feof(in_RSI);
  uVar3 = 0;
  if (iVar5 == 0) {
    uVar3 = 0;
    do {
      uVar1 = fgetc(in_RSI);
      if (uVar1 != 0xd) {
        if ((uVar1 < 0x21) && ((0x100000600U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
          if (uVar3 != 0) {
            if (uVar1 == 10) {
              ungetc(10,in_RSI);
            }
            break;
          }
          if (uVar1 == 10) {
            *(undefined1 *)(puVar4 + 1) = 0;
            *puVar4 = 0x3e732f3c;
            return;
          }
        }
        else {
          *(char *)((long)puVar4 + (ulong)uVar3) = (char)uVar1;
          uVar3 = uVar3 + (uVar3 < 0x62);
        }
      }
      iVar5 = feof(in_RSI);
    } while (iVar5 == 0);
  }
  *(undefined1 *)((long)puVar4 + (long)(int)uVar3) = 0;
  return;
}

Assistant:

void InitUnigramTable() {
  int a, i;
  double train_words_pow = 0;
  double d1, power = 0.75;
  table = (int *)malloc(table_size * sizeof(int));
  if (table == NULL) {
    fprintf(stderr, "cannot allocate memory for the table\n");
    exit(1);
  }
  for (a = 0; a < vocab_size; a++) train_words_pow += pow(vocab[a].cn, power);
  i = 0;
  d1 = pow(vocab[i].cn, power) / train_words_pow;
  for (a = 0; a < table_size; a++) {
    table[a] = i;
    if (a / (double)table_size > d1) {
      i++;
      d1 += pow(vocab[i].cn, power) / train_words_pow;
    }
    if (i >= vocab_size) i = vocab_size - 1;
  }
}